

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::computeDualObjectiveValue(HEkk *this,HighsInt phase)

{
  double dVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  int in_ESI;
  long in_RDI;
  double term;
  HighsInt iCol;
  HighsInt num_tot;
  HighsSimplexAnalysis *in_stack_ffffffffffffffe0;
  undefined4 local_14;
  
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_ffffffffffffffe0,(HighsInt)((ulong)in_RDI >> 0x20),(HighsInt)in_RDI);
  *(undefined8 *)(in_RDI + 0x2948) = 0;
  iVar2 = *(int *)(in_RDI + 0x2198);
  iVar3 = *(int *)(in_RDI + 0x219c);
  for (local_14 = 0; local_14 < iVar2 + iVar3; local_14 = local_14 + 1) {
    pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990),
                        (long)local_14);
    if (*pvVar4 != '\0') {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                          (long)local_14);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2578),
                          (long)local_14);
      in_stack_ffffffffffffffe0 = (HighsSimplexAnalysis *)(dVar1 * *pvVar5);
      if (((double)in_stack_ffffffffffffffe0 != 0.0) || (NAN((double)in_stack_ffffffffffffffe0))) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x25f0),
                            (long)local_14);
        dVar1 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2578),
                            (long)local_14);
        *(double *)(in_RDI + 0x2948) = dVar1 * *pvVar5 + *(double *)(in_RDI + 0x2948);
      }
    }
  }
  *(double *)(in_RDI + 0x2948) = *(double *)(in_RDI + 0x36e0) * *(double *)(in_RDI + 0x2948);
  if (in_ESI != 1) {
    *(double *)(in_RDI + 0x2948) =
         (double)*(int *)(in_RDI + 0x2288) * *(double *)(in_RDI + 0x2290) +
         *(double *)(in_RDI + 0x2948);
  }
  *(undefined1 *)(in_RDI + 0x255b) = 1;
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_ffffffffffffffe0,(HighsInt)((ulong)in_RDI >> 0x20),(HighsInt)in_RDI);
  return;
}

Assistant:

void HEkk::computeDualObjectiveValue(const HighsInt phase) {
  analysis_.simplexTimerStart(ComputeDuObjClock);
  info_.dual_objective_value = 0;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
    if (basis_.nonbasicFlag_[iCol]) {
      const double term = info_.workValue_[iCol] * info_.workDual_[iCol];
      if (term) {
        info_.dual_objective_value +=
            info_.workValue_[iCol] * info_.workDual_[iCol];
      }
    }
  }
  info_.dual_objective_value *= cost_scale_;
  if (phase != 1) {
    // In phase 1 the dual objective has no objective
    // shift. Otherwise, if minimizing the shift is added. If
    // maximizing, workCost (and hence workDual) are negated, so the
    // shift is subtracted. Hence the shift is added according to the
    // sign implied by sense_
    info_.dual_objective_value += ((HighsInt)lp_.sense_) * lp_.offset_;
  }
  // Now have dual objective value
  status_.has_dual_objective_value = true;
  analysis_.simplexTimerStop(ComputeDuObjClock);
}